

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<Blob<160>,block16>
               (block16 *key,int len,int maxlen,block16 *blocks,int blockcount,pfHash hash,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  undefined8 uVar1;
  long lVar2;
  Blob<160> h;
  undefined1 local_48 [16];
  uint8_t local_38 [8];
  
  if (0 < blockcount && len != maxlen) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)(blocks->c + lVar2 + 8);
      *(undefined8 *)key[len].c = *(undefined8 *)(blocks->c + lVar2);
      *(undefined8 *)(key[len].c + 8) = uVar1;
      local_48 = ZEXT816(0) << 0x20;
      local_38[0] = '\0';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      (*hash)(key,(len + 1) * 0x10,0,(value_type *)local_48);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,(value_type *)local_48);
      CombinationKeygenRecurse<Blob<160>,block16>(key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)blockcount << 4 != lVar2);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}